

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeDepthCompare
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,TestFunc depthFunc,ConstPixelBufferAccess *depthBuffer)

{
  float fVar1;
  ChannelType CVar2;
  ulong uVar3;
  ulong uVar4;
  ChannelOrder CVar5;
  int iVar6;
  int iVar7;
  bool *pbVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  deUint32 buffer [2];
  undefined1 local_68 [16];
  PixelBufferAccess access;
  
  CVar2 = (depthBuffer->m_format).type;
  if ((CVar2 == FLOAT_UNSIGNED_INT_24_8_REV) || (CVar2 == FLOAT)) {
    switch(depthFunc) {
    case TESTFUNC_NEVER:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixDepth
                    (depthBuffer,(int)((long)uVar3 % (long)numSamplesPerFragment),
                     inputFragments[iVar6].pixelCoord.m_data[0],
                     inputFragments[iVar6].pixelCoord.m_data[1]);
          *pbVar8 = false;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_ALWAYS:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixDepth
                    (depthBuffer,(int)((long)uVar3 % (long)numSamplesPerFragment),
                     inputFragments[iVar6].pixelCoord.m_data[0],
                     inputFragments[iVar6].pixelCoord.m_data[1]);
          *pbVar8 = true;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_LESS:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar10 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar4,inputFragments[iVar6].pixelCoord.m_data[0],
                              inputFragments[iVar6].pixelCoord.m_data[1]);
          fVar1 = inputFragments[iVar6].sampleDepths[uVar4 & 0xffffffff];
          fVar11 = 1.0;
          if (fVar1 <= 1.0) {
            fVar11 = fVar1;
          }
          *pbVar8 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar11) < fVar10;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_LEQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar10 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar4,inputFragments[iVar6].pixelCoord.m_data[0],
                              inputFragments[iVar6].pixelCoord.m_data[1]);
          fVar1 = inputFragments[iVar6].sampleDepths[uVar4 & 0xffffffff];
          fVar11 = 1.0;
          if (fVar1 <= 1.0) {
            fVar11 = fVar1;
          }
          *pbVar8 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar11) <= fVar10;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_GREATER:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar10 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar4,inputFragments[iVar6].pixelCoord.m_data[0],
                              inputFragments[iVar6].pixelCoord.m_data[1]);
          fVar1 = inputFragments[iVar6].sampleDepths[uVar4 & 0xffffffff];
          fVar11 = 1.0;
          if (fVar1 <= 1.0) {
            fVar11 = fVar1;
          }
          *pbVar8 = fVar10 < (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar11);
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_GEQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar10 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar4,inputFragments[iVar6].pixelCoord.m_data[0],
                              inputFragments[iVar6].pixelCoord.m_data[1]);
          fVar1 = inputFragments[iVar6].sampleDepths[uVar4 & 0xffffffff];
          fVar11 = 1.0;
          if (fVar1 <= 1.0) {
            fVar11 = fVar1;
          }
          *pbVar8 = fVar10 <= (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar11);
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_EQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar10 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar4,inputFragments[iVar6].pixelCoord.m_data[0],
                              inputFragments[iVar6].pixelCoord.m_data[1]);
          fVar1 = inputFragments[iVar6].sampleDepths[uVar4 & 0xffffffff];
          fVar11 = 1.0;
          if (fVar1 <= 1.0) {
            fVar11 = fVar1;
          }
          *pbVar8 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar11) == fVar10;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_NOTEQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar6 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar10 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar4,inputFragments[iVar6].pixelCoord.m_data[0],
                              inputFragments[iVar6].pixelCoord.m_data[1]);
          fVar1 = inputFragments[iVar6].sampleDepths[uVar4 & 0xffffffff];
          fVar11 = 1.0;
          if (fVar1 <= 1.0) {
            fVar11 = fVar1;
          }
          *pbVar8 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar11) != fVar10;
        }
        pbVar8 = pbVar8 + 0x84;
      }
    }
  }
  else {
    iVar6 = (int)depthBuffer;
    switch(depthFunc) {
    case TESTFUNC_NEVER:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess(&access,&depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth(&access,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access,0,0);
          *pbVar8 = false;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_ALWAYS:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess(&access,&depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth(&access,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access,0,0);
          *pbVar8 = true;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_LESS:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          CVar5 = access.super_ConstPixelBufferAccess.m_format.order;
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,
                     &depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access.super_ConstPixelBufferAccess,0,
                     0);
          *pbVar8 = (uint)local_68._0_4_ < CVar5;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_LEQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          CVar5 = access.super_ConstPixelBufferAccess.m_format.order;
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,
                     &depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access.super_ConstPixelBufferAccess,0,
                     0);
          *pbVar8 = (uint)local_68._0_4_ <= CVar5;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_GREATER:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          CVar5 = access.super_ConstPixelBufferAccess.m_format.order;
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,
                     &depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access.super_ConstPixelBufferAccess,0,
                     0);
          *pbVar8 = CVar5 < (uint)local_68._0_4_;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_GEQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          CVar5 = access.super_ConstPixelBufferAccess.m_format.order;
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,
                     &depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access.super_ConstPixelBufferAccess,0,
                     0);
          *pbVar8 = CVar5 <= (uint)local_68._0_4_;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_EQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          CVar5 = access.super_ConstPixelBufferAccess.m_format.order;
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,
                     &depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access.super_ConstPixelBufferAccess,0,
                     0);
          *pbVar8 = local_68._0_4_ == CVar5;
        }
        pbVar8 = pbVar8 + 0x84;
      }
      break;
    case TESTFUNC_NOTEQUAL:
      pbVar8 = &this->m_sampleRegister[0].depthPassed;
      for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
        if (((SampleData *)(pbVar8 + -2))->isAlive == true) {
          uVar3 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
          uVar4 = (long)uVar3 % (long)numSamplesPerFragment;
          iVar7 = (int)((long)uVar3 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&access.super_ConstPixelBufferAccess,iVar6,(int)uVar4,
                     inputFragments[iVar7].pixelCoord.m_data[0]);
          CVar5 = access.super_ConstPixelBufferAccess.m_format.order;
          fVar1 = inputFragments[iVar7].sampleDepths[uVar4 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,
                     &depthBuffer->m_format,1,1,1,buffer);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,fVar1,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_68,(int)&access.super_ConstPixelBufferAccess,0,
                     0);
          *pbVar8 = local_68._0_4_ != CVar5;
        }
        pbVar8 = pbVar8 + 0x84;
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeDepthCompare (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, TestFunc depthFunc, const tcu::ConstPixelBufferAccess& depthBuffer)
{
#define SAMPLE_REGISTER_DEPTH_COMPARE_F(COMPARE_EXPRESSION)																						\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																\
	{																																			\
		if (m_sampleRegister[regSampleNdx].isAlive)																								\
		{																																		\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;														\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];						\
			float				depthBufferValue	= depthBuffer.getPixDepth(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());			\
			float				sampleDepthFloat	= frag.sampleDepths[fragSampleNdx];															\
			float				sampleDepth			= de::clamp(sampleDepthFloat, 0.0f, 1.0f);													\
																																				\
			m_sampleRegister[regSampleNdx].depthPassed = (COMPARE_EXPRESSION);																	\
																																				\
			DE_UNREF(depthBufferValue);																											\
			DE_UNREF(sampleDepth);																												\
		}																																		\
	}

#define SAMPLE_REGISTER_DEPTH_COMPARE_UI(COMPARE_EXPRESSION)																					\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																\
	{																																			\
		if (m_sampleRegister[regSampleNdx].isAlive)																								\
		{																																		\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;														\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];						\
			deUint32			depthBufferValue	= depthBuffer.getPixelUint(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y()).x();	\
			float				sampleDepthFloat	= frag.sampleDepths[fragSampleNdx];															\
																																				\
			/* Convert input float to target buffer format for comparison */																	\
																																				\
			deUint32 buffer[2];																													\
																																				\
			DE_ASSERT(sizeof(buffer) >= (size_t)depthBuffer.getFormat().getPixelSize());														\
																																				\
			tcu::PixelBufferAccess access(depthBuffer.getFormat(), 1, 1, 1, &buffer);															\
			access.setPixDepth(sampleDepthFloat, 0, 0, 0);																						\
			deUint32 sampleDepth = access.getPixelUint(0, 0, 0).x();																			\
																																				\
			m_sampleRegister[regSampleNdx].depthPassed = (COMPARE_EXPRESSION);																	\
																																				\
			DE_UNREF(depthBufferValue);																											\
			DE_UNREF(sampleDepth);																												\
		}